

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2projections.cc
# Opt level: O0

R2Point __thiscall S2::MercatorProjection::Project(MercatorProjection *this,S2Point *p)

{
  R2Point RVar1;
  S2LatLng local_38;
  S2Point *local_28;
  S2Point *p_local;
  MercatorProjection *this_local;
  
  local_28 = p;
  p_local = (S2Point *)this;
  S2LatLng::S2LatLng(&local_38,p);
  RVar1 = FromLatLng(this,&local_38);
  return (R2Point)RVar1.c_;
}

Assistant:

R2Point MercatorProjection::Project(const S2Point& p) const {
  return FromLatLng(S2LatLng(p));
}